

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

string * __thiscall
RegressionTree::genVarianceComputation_abi_cxx11_
          (string *__return_storage_ptr__,RegressionTree *this)

{
  Query *pQVar1;
  pointer ppAVar2;
  unsigned_long *puVar3;
  Query *pQVar4;
  unsigned_long *puVar5;
  pointer pvVar6;
  long lVar7;
  pointer pQVar8;
  bool bVar9;
  size_t sVar10;
  ostream *poVar11;
  Attribute *pAVar12;
  View *pVVar13;
  pointer pQVar14;
  unsigned_long *puVar15;
  unsigned_long uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  unsigned_long *puVar17;
  unsigned_long *puVar18;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar19;
  ulong uVar20;
  ulong __val;
  long lVar21;
  unsigned_long *local_878;
  long local_870;
  unsigned_long local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  unsigned_long *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  string thresholdStruct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  string functionIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  string computeVariance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  string contVariance;
  string local_6b8;
  string numOfThresholds;
  string categVariance;
  string local_658;
  string local_638;
  string contFunctionIndex;
  unsigned_long *local_5f8;
  string categFunctionIndex;
  string initVariance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  variancePerView;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  functionPerView;
  string local_c0;
  vector<Query_*,_std::allocator<Query_*>_> complementQueryPerView;
  vector<unsigned_long,_std::allocator<unsigned_long>_> firstThreshold;
  string local_70;
  string local_50;
  
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&variancePerView,sVar10,(allocator_type *)&numOfThresholds);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&functionPerView,sVar10,(allocator_type *)&numOfThresholds);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&firstThreshold,100,(allocator_type *)&numOfThresholds);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<Query_*,_std::allocator<Query_*>_>::vector
            (&complementQueryPerView,sVar10,(allocator_type *)&numOfThresholds);
  pQVar8 = queryToThreshold.
           super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pQVar14 = queryToThreshold.
                 super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl
                 .super__Vector_impl_data._M_start; pQVar14 != pQVar8; pQVar14 = pQVar14 + 1) {
    pQVar1 = pQVar14->query;
    ppAVar2 = (pQVar1->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar3 = *(unsigned_long **)
              &((*ppAVar2)->_incoming).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl;
    puVar17 = *(unsigned_long **)
               &(ppAVar2[1]->_incoming).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl;
    puVar15 = *(unsigned_long **)
               &(ppAVar2[2]->_incoming).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl;
    if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[pQVar14->varID >> 6] >>
         (pQVar14->varID & 0x3f) & 1) == 0) {
      puVar5 = *(unsigned_long **)
                &(ppAVar2[3]->_incoming).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl;
      uVar16 = *puVar3;
      if ((((uVar16 != *puVar17) || (uVar16 != *puVar15)) || (*puVar5 != uVar16)) ||
         ((puVar18 = *(unsigned_long **)
                      &(ppAVar2[4]->_incoming).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl, *puVar18 != uVar16 ||
          (local_5f8 = *(unsigned_long **)
                        &(ppAVar2[5]->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl, local_878 = puVar5, local_820 = puVar3, *local_5f8 != uVar16))))
      {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "THERE IS AN ERROR IN genVarianceComputation");
        std::endl<char,std::char_traits<char>>(poVar11);
        ppAVar2 = (pQVar1->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_820 = *(unsigned_long **)
                     &((*ppAVar2)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
        puVar17 = *(unsigned_long **)
                   &(ppAVar2[1]->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
        puVar15 = *(unsigned_long **)
                   &(ppAVar2[2]->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
        local_878 = *(unsigned_long **)
                     &(ppAVar2[3]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
        puVar18 = *(unsigned_long **)
                   &(ppAVar2[4]->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
        local_5f8 = *(unsigned_long **)
                     &(ppAVar2[5]->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
        uVar16 = *puVar3;
      }
      std::__cxx11::to_string(&contVariance,uVar16);
      std::operator+(&initVariance,"V",&contVariance);
      std::operator+(&numOfThresholds,&initVariance,"tuple");
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (variancePerView.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *puVar3);
      std::operator+(&local_450,"((",&numOfThresholds);
      std::operator+(&local_590,&local_450,".aggregates[");
      std::__cxx11::to_string(&local_210,local_820[1]);
      std::operator+(&local_430,&local_590,&local_210);
      std::operator+(&local_410,&local_430,"] > 0  && ");
      std::operator+(&local_3f0,&local_410,&numOfThresholds);
      std::operator+(&local_570,&local_3f0,".aggregates[");
      std::__cxx11::to_string(&local_2f0,local_878[1]);
      std::operator+(&local_550,&local_570,&local_2f0);
      std::operator+(&local_3d0,&local_550,"] > 0) ? ");
      std::operator+(&local_530,&local_3d0,&numOfThresholds);
      std::operator+(&local_510,&local_530,".aggregates[");
      std::__cxx11::to_string(&local_230,puVar15[1]);
      std::operator+(&local_3b0,&local_510,&local_230);
      std::operator+(&local_390,&local_3b0,"] - (");
      std::operator+(&local_370,&local_390,&numOfThresholds);
      std::operator+(&local_4f0,&local_370,".aggregates[");
      std::__cxx11::to_string(&local_310,puVar17[1]);
      std::operator+(&local_4d0,&local_4f0,&local_310);
      std::operator+(&local_350,&local_4d0,"] * ");
      std::operator+(&local_4b0,&local_350,&numOfThresholds);
      std::operator+(&local_490,&local_4b0,".aggregates[");
      std::__cxx11::to_string(&local_250,puVar17[1]);
      std::operator+(&local_470,&local_490,&local_250);
      std::operator+(&local_5b0,&local_470,"]) / ");
      std::operator+(&local_658,&local_5b0,&numOfThresholds);
      std::operator+(&local_638,&local_658,".aggregates[");
      std::__cxx11::to_string(&local_330,local_820[1]);
      std::operator+(&local_6b8,&local_638,&local_330);
      std::operator+(&local_6f8,&local_6b8,"] + ");
      std::operator+(&local_718,&local_6f8,&numOfThresholds);
      std::operator+(&local_758,&local_718,".aggregates[");
      std::__cxx11::to_string(&local_270,local_5f8[1]);
      std::operator+(&local_778,&local_758,&local_270);
      std::operator+(&local_7b8,&local_778,"] - (");
      std::operator+(&local_840,&local_7b8,&numOfThresholds);
      std::operator+(&local_818,&local_840,".aggregates[");
      std::__cxx11::to_string(&local_290,puVar18[1]);
      std::operator+(&local_7f8,&local_818,&local_290);
      std::operator+(&local_860,&local_7f8,"] * ");
      std::operator+(&thresholdStruct,&local_860,&numOfThresholds);
      std::operator+(&functionIndex,&thresholdStruct,".aggregates[");
      std::__cxx11::to_string(&local_2b0,puVar18[1]);
      std::operator+(&computeVariance,&functionIndex,&local_2b0);
      std::operator+(&categFunctionIndex,&computeVariance,"]) / ");
      std::operator+(&contFunctionIndex,&categFunctionIndex,&numOfThresholds);
      std::operator+(&categVariance,&contFunctionIndex,".aggregates[");
      std::__cxx11::to_string(&local_2d0,local_878[1]);
      std::operator+(&contVariance,&categVariance,&local_2d0);
      std::operator+(&initVariance,&contVariance,"] : 1.79769e+308);\n");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar19,&initVariance);
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&categVariance);
      std::__cxx11::string::~string((string *)&contFunctionIndex);
      std::__cxx11::string::~string((string *)&categFunctionIndex);
      std::__cxx11::string::~string((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_450);
      pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (functionPerView.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *puVar3);
      std::__cxx11::to_string(&local_718,pQVar14->varID);
      std::operator+(&local_758,".set(",&local_718);
      std::operator+(&local_778,&local_758,",");
      std::__cxx11::to_string(&local_6f8,*pQVar14->function->_parameter);
      std::operator+(&local_7b8,&local_778,&local_6f8);
      std::operator+(&local_840,&local_7b8,",0,");
      std::operator+(&local_818,&local_840,"&V");
      std::__cxx11::to_string(&local_6b8,*puVar3);
      std::operator+(&local_7f8,&local_818,&local_6b8);
      std::operator+(&local_860,&local_7f8,"[0].aggregates[");
      std::__cxx11::to_string(&local_638,local_820[1]);
      std::operator+(&thresholdStruct,&local_860,&local_638);
      std::operator+(&functionIndex,&thresholdStruct,"],");
      std::operator+(&computeVariance,&functionIndex,"&V");
      std::__cxx11::to_string(&local_658,*puVar5);
      std::operator+(&categFunctionIndex,&computeVariance,&local_658);
      std::operator+(&contFunctionIndex,&categFunctionIndex,"[0].aggregates[");
      std::__cxx11::to_string(&local_5b0,local_878[1]);
      std::operator+(&categVariance,&contFunctionIndex,&local_5b0);
      std::operator+(&contVariance,&categVariance,"]");
      std::operator+(&initVariance,&contVariance,");\n");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar19,&initVariance);
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      std::__cxx11::string::~string((string *)&categVariance);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&contFunctionIndex);
      std::__cxx11::string::~string((string *)&categFunctionIndex);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      this_00 = &local_718;
    }
    else {
      pQVar4 = pQVar14->complementQuery;
      puVar5 = *(unsigned_long **)
                &((*(pQVar4->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->_incoming).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data;
      uVar16 = *puVar3;
      if ((uVar16 != *puVar17) || (local_820 = puVar3, local_5f8 = puVar5, uVar16 != *puVar15)) {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "THERE IS AN ERROR IN genVarianceComputation");
        std::endl<char,std::char_traits<char>>(poVar11);
        ppAVar2 = (pQVar1->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_820 = *(unsigned_long **)
                     &((*ppAVar2)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl;
        puVar17 = *(unsigned_long **)
                   &(ppAVar2[1]->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
        puVar15 = *(unsigned_long **)
                   &(ppAVar2[2]->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl;
        local_5f8 = *(unsigned_long **)
                     &((*(pQVar4->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data;
        uVar16 = *puVar3;
      }
      std::__cxx11::to_string(&contVariance,uVar16);
      std::operator+(&initVariance,"V",&contVariance);
      std::operator+(&numOfThresholds,&initVariance,"tuple");
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (variancePerView.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *puVar3);
      std::operator+(&local_718,&numOfThresholds,".aggregates[");
      std::__cxx11::to_string(&local_6f8,puVar15[1]);
      std::operator+(&local_758,&local_718,&local_6f8);
      std::operator+(&local_778,&local_758,"] - (");
      std::operator+(&local_7b8,&local_778,&numOfThresholds);
      std::operator+(&local_840,&local_7b8,".aggregates[");
      std::__cxx11::to_string(&local_6b8,puVar17[1]);
      std::operator+(&local_818,&local_840,&local_6b8);
      std::operator+(&local_7f8,&local_818,"] * ");
      std::operator+(&local_860,&local_7f8,&numOfThresholds);
      std::operator+(&thresholdStruct,&local_860,".aggregates[");
      std::__cxx11::to_string(&local_638,puVar17[1]);
      std::operator+(&functionIndex,&thresholdStruct,&local_638);
      std::operator+(&computeVariance,&functionIndex,"]) / ");
      std::operator+(&categFunctionIndex,&computeVariance,&numOfThresholds);
      std::operator+(&contFunctionIndex,&categFunctionIndex,".aggregates[");
      std::__cxx11::to_string(&local_658,local_820[1]);
      std::operator+(&categVariance,&contFunctionIndex,&local_658);
      std::operator+(&contVariance,&categVariance,"] + ");
      std::operator+(&initVariance,&contVariance,
                     "difference[2] - (difference[1] * difference[1]) / difference[0];\n");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar19,&initVariance);
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      std::__cxx11::string::~string((string *)&categVariance);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&contFunctionIndex);
      std::__cxx11::string::~string((string *)&categFunctionIndex);
      std::__cxx11::string::~string((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      complementQueryPerView.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar3] = pQVar4;
      pAVar12 = TreeDecomposition::getAttribute
                          ((this->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           pQVar14->varID);
      pvVar19 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (functionPerView.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *puVar3);
      std::__cxx11::to_string(&local_778,pQVar14->varID);
      std::operator+(&local_7b8,".set(",&local_778);
      std::operator+(&local_840,&local_7b8,",tuple.");
      std::operator+(&local_818,&local_840,&pAVar12->_name);
      std::operator+(&local_7f8,&local_818,",1,");
      std::operator+(&local_860,&local_7f8,"&tuple.aggregates[");
      std::__cxx11::to_string(&local_758,local_820[1]);
      std::operator+(&thresholdStruct,&local_860,&local_758);
      std::operator+(&functionIndex,&thresholdStruct,"],");
      std::operator+(&computeVariance,&functionIndex,"&V");
      std::__cxx11::to_string(&local_718,*puVar5);
      std::operator+(&categFunctionIndex,&computeVariance,&local_718);
      std::operator+(&contFunctionIndex,&categFunctionIndex,"[0].aggregates[");
      std::__cxx11::to_string(&local_6f8,local_5f8[1]);
      std::operator+(&categVariance,&contFunctionIndex,&local_6f8);
      std::operator+(&contVariance,&categVariance,"]");
      std::operator+(&initVariance,&contVariance,");\n");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar19,&initVariance);
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      std::__cxx11::string::~string((string *)&categVariance);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&contFunctionIndex);
      std::__cxx11::string::~string((string *)&categFunctionIndex);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      this_00 = &local_778;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&numOfThresholds);
  }
  std::__cxx11::string::string
            ((string *)&numOfThresholds,"numberOfThresholds = ",(allocator *)&initVariance);
  lVar21 = 0;
  local_868 = 0;
  for (sVar10 = 0; sVar10 != 100; sVar10 = sVar10 + 1) {
    bVar9 = std::bitset<100UL>::test(&this->_features,sVar10);
    if (bVar9) {
      bVar9 = std::bitset<100UL>::test(&this->_categoricalFeatures,sVar10);
      if (bVar9) {
        std::__cxx11::to_string
                  (&categVariance,
                   **(unsigned_long **)
                     &((*(this->_varToQueryMap[sVar10]->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data);
        std::operator+(&contVariance,"V",&categVariance);
        std::operator+(&initVariance,&contVariance,".size() + ");
        std::__cxx11::string::append((string *)&numOfThresholds);
        std::__cxx11::string::~string((string *)&initVariance);
        std::__cxx11::string::~string((string *)&contVariance);
        std::__cxx11::string::~string((string *)&categVariance);
      }
      else {
        firstThreshold.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar10] = local_868;
        pvVar6 = (this->_thresholds).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_868 = local_868 +
                    (*(long *)((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar21 + 8) -
                     *(long *)((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar21) >> 3);
      }
    }
    lVar21 = lVar21 + 0x18;
  }
  std::__cxx11::to_string(&contVariance,local_868);
  std::operator+(&initVariance,&contVariance,";\n");
  std::__cxx11::string::append((string *)&numOfThresholds);
  std::__cxx11::string::~string((string *)&initVariance);
  std::__cxx11::string::~string((string *)&contVariance);
  Application::offset_abi_cxx11_(&contFunctionIndex,&this->super_Application,2);
  std::operator+(&categVariance,&contFunctionIndex,&numOfThresholds);
  Application::offset_abi_cxx11_(&categFunctionIndex,&this->super_Application,2);
  std::operator+(&contVariance,&categVariance,&categFunctionIndex);
  std::operator+(&initVariance,&contVariance,"variance = new double[numberOfThresholds];\n");
  std::__cxx11::string::~string((string *)&contVariance);
  std::__cxx11::string::~string((string *)&categFunctionIndex);
  std::__cxx11::string::~string((string *)&categVariance);
  std::__cxx11::string::~string((string *)&contFunctionIndex);
  std::__cxx11::string::string((string *)&contVariance,"",(allocator *)&categVariance);
  std::__cxx11::string::string((string *)&categVariance,"",(allocator *)&contFunctionIndex);
  std::__cxx11::string::string((string *)&contFunctionIndex,"",(allocator *)&categFunctionIndex);
  std::__cxx11::string::string((string *)&categFunctionIndex,"",(allocator *)&computeVariance);
  __val = 0;
  local_820 = (unsigned_long *)0x0;
  do {
    sVar10 = QueryCompiler::numberOfViews
                       ((this->_compiler).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar10 <= __val) {
      std::__cxx11::string::string((string *)&computeVariance,(string *)&contVariance);
      if (categVariance._M_string_length != 0) {
        Application::offset_abi_cxx11_(&local_7b8,&this->super_Application,2);
        std::operator+(&local_840,&local_7b8,"size_t categIdx = ");
        std::__cxx11::to_string(&local_778,local_868);
        std::operator+(&local_818,&local_840,&local_778);
        std::operator+(&local_7f8,&local_818,";\n");
        Application::offset_abi_cxx11_(&local_758,&this->super_Application,2);
        std::operator+(&local_860,&local_7f8,&local_758);
        std::operator+(&thresholdStruct,&local_860,"double difference[3], *compaggs;\n");
        std::operator+(&functionIndex,&thresholdStruct,&categVariance);
        std::__cxx11::string::append((string *)&computeVariance);
        std::__cxx11::string::~string((string *)&functionIndex);
        std::__cxx11::string::~string((string *)&thresholdStruct);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        std::__cxx11::string::~string((string *)&local_778);
        std::__cxx11::string::~string((string *)&local_840);
        std::__cxx11::string::~string((string *)&local_7b8);
      }
      Application::offset_abi_cxx11_(&local_310,&this->super_Application,2);
      std::operator+(&local_230,"\n",&local_310);
      std::operator+(&local_2f0,&local_230,"double min_variance = variance[0];\n");
      Application::offset_abi_cxx11_(&local_250,&this->super_Application,2);
      std::operator+(&local_210,&local_2f0,&local_250);
      std::operator+(&local_450,&local_210,"size_t threshold = 0;\n\n");
      Application::offset_abi_cxx11_(&local_330,&this->super_Application,2);
      std::operator+(&local_590,&local_450,&local_330);
      std::operator+(&local_430,&local_590,"for (size_t t=1; t < numberOfThresholds; ++t)\n");
      Application::offset_abi_cxx11_(&local_270,&this->super_Application,2);
      std::operator+(&local_410,&local_430,&local_270);
      std::operator+(&local_3f0,&local_410,"{\n");
      Application::offset_abi_cxx11_(&local_290,&this->super_Application,3);
      std::operator+(&local_570,&local_3f0,&local_290);
      std::operator+(&local_550,&local_570,"if (variance[t] < min_variance)\n");
      Application::offset_abi_cxx11_(&local_2b0,&this->super_Application,3);
      std::operator+(&local_3d0,&local_550,&local_2b0);
      std::operator+(&local_530,&local_3d0,"{\n");
      Application::offset_abi_cxx11_(&local_2d0,&this->super_Application,4);
      std::operator+(&local_510,&local_530,&local_2d0);
      std::operator+(&local_3b0,&local_510,"min_variance = variance[t];\n");
      Application::offset_abi_cxx11_(&local_110,&this->super_Application,4);
      std::operator+(&local_390,&local_3b0,&local_110);
      std::operator+(&local_370,&local_390,"threshold = t;\n");
      Application::offset_abi_cxx11_(&local_130,&this->super_Application,3);
      std::operator+(&local_4f0,&local_370,&local_130);
      std::operator+(&local_4d0,&local_4f0,"}\n");
      Application::offset_abi_cxx11_(&local_150,&this->super_Application,2);
      std::operator+(&local_350,&local_4d0,&local_150);
      std::operator+(&local_4b0,&local_350,"}\n");
      Application::offset_abi_cxx11_(&local_170,&this->super_Application,2);
      std::operator+(&local_490,&local_4b0,&local_170);
      std::operator+(&local_470,&local_490,
                     "std::cout << \"The minimum variance is: \" << min_variance <<");
      std::operator+(&local_5b0,&local_470,
                     "\" for variable \" << thresholdMap[threshold].varID << \" and threshold:");
      std::operator+(&local_658,&local_5b0,
                     " \" << thresholdMap[threshold].threshold << std::endl;\n");
      Application::offset_abi_cxx11_(&local_190,&this->super_Application,2);
      std::operator+(&local_638,&local_658,&local_190);
      std::operator+(&local_6b8,&local_638,
                     "std::ofstream ofs(\"bestsplit.out\",std::ofstream::out);\n");
      Application::offset_abi_cxx11_(&local_1b0,&this->super_Application,2);
      std::operator+(&local_6f8,&local_6b8,&local_1b0);
      std::operator+(&local_718,&local_6f8,"ofs << std::fixed << min_variance << \"\\t\" << ");
      std::operator+(&local_758,&local_718,"thresholdMap[threshold].varID << \"\\t\" << ");
      std::operator+(&local_778,&local_758,"thresholdMap[threshold].threshold  << \"\\t\" << ");
      std::operator+(&local_7b8,&local_778,"thresholdMap[threshold].categorical  << \"\\t\" << ");
      std::operator+(&local_840,&local_7b8,"thresholdMap[threshold].aggregates[0]  << \"\\t\" << ");
      std::operator+(&local_818,&local_840,
                     "thresholdMap[threshold].compAggregates[0] << \"\\t\" << ");
      std::operator+(&local_7f8,&local_818,
                     "thresholdMap[threshold].aggregates[1]/thresholdMap[threshold].aggregates[0] << \"\\t\" << "
                    );
      std::operator+(&local_860,&local_7f8,
                     "thresholdMap[threshold].compAggregates[1]/thresholdMap[threshold].compAggregates[0] << std::endl;\n"
                    );
      Application::offset_abi_cxx11_(&local_1d0,&this->super_Application,2);
      std::operator+(&thresholdStruct,&local_860,&local_1d0);
      std::operator+(&functionIndex,&thresholdStruct,"ofs.close();\n");
      std::__cxx11::string::append((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string((string *)&functionIndex,(string *)&contFunctionIndex);
      if (categFunctionIndex._M_string_length != 0) {
        Application::offset_abi_cxx11_(&local_840,&this->super_Application,2);
        std::operator+(&local_818,&local_840,"size_t categIdx = ");
        std::__cxx11::to_string(&local_7b8,local_868);
        std::operator+(&local_7f8,&local_818,&local_7b8);
        std::operator+(&local_860,&local_7f8,";\n");
        std::operator+(&thresholdStruct,&local_860,&categFunctionIndex);
        std::__cxx11::string::append((string *)&functionIndex);
        std::__cxx11::string::~string((string *)&thresholdStruct);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_818);
        std::__cxx11::string::~string((string *)&local_840);
      }
      Application::offset_abi_cxx11_(&local_2f0,&this->super_Application,1);
      std::operator+(&local_210,&local_2f0,"struct Threshold\n");
      Application::offset_abi_cxx11_(&local_230,&this->super_Application,1);
      std::operator+(&local_450,&local_210,&local_230);
      std::operator+(&local_590,&local_450,"{\n");
      Application::offset_abi_cxx11_(&local_310,&this->super_Application,2);
      std::operator+(&local_430,&local_590,&local_310);
      std::operator+(&local_410,&local_430,"size_t varID;\n");
      Application::offset_abi_cxx11_(&local_250,&this->super_Application,2);
      std::operator+(&local_3f0,&local_410,&local_250);
      std::operator+(&local_570,&local_3f0,"double threshold;\n");
      Application::offset_abi_cxx11_(&local_330,&this->super_Application,2);
      std::operator+(&local_550,&local_570,&local_330);
      std::operator+(&local_3d0,&local_550,"bool categorical;\n");
      Application::offset_abi_cxx11_(&local_270,&this->super_Application,2);
      std::operator+(&local_530,&local_3d0,&local_270);
      std::operator+(&local_510,&local_530,"double* aggregates;\n");
      Application::offset_abi_cxx11_(&local_290,&this->super_Application,2);
      std::operator+(&local_3b0,&local_510,&local_290);
      std::operator+(&local_390,&local_3b0,"double* compAggregates;\n");
      Application::offset_abi_cxx11_(&local_2b0,&this->super_Application,2);
      std::operator+(&local_370,&local_390,&local_2b0);
      std::operator+(&local_4f0,&local_370,
                     "Threshold() : varID(0), threshold(0), categorical(false), ");
      std::operator+(&local_4d0,&local_4f0,"aggregates(nullptr), compAggregates(nullptr) {}\n");
      Application::offset_abi_cxx11_(&local_2d0,&this->super_Application,2);
      std::operator+(&local_350,&local_4d0,&local_2d0);
      std::operator+(&local_4b0,&local_350,
                     "void set(size_t var, double t, bool c, double* agg, double *cagg)\n");
      Application::offset_abi_cxx11_(&local_110,&this->super_Application,2);
      std::operator+(&local_490,&local_4b0,&local_110);
      std::operator+(&local_470,&local_490,"{\n");
      Application::offset_abi_cxx11_(&local_130,&this->super_Application,3);
      std::operator+(&local_5b0,&local_470,&local_130);
      std::operator+(&local_658,&local_5b0,"varID = var;\n");
      Application::offset_abi_cxx11_(&local_150,&this->super_Application,3);
      std::operator+(&local_638,&local_658,&local_150);
      std::operator+(&local_6b8,&local_638,"threshold = t;\n");
      Application::offset_abi_cxx11_(&local_170,&this->super_Application,3);
      std::operator+(&local_6f8,&local_6b8,&local_170);
      std::operator+(&local_718,&local_6f8,"categorical = c;\n");
      Application::offset_abi_cxx11_(&local_190,&this->super_Application,3);
      std::operator+(&local_758,&local_718,&local_190);
      std::operator+(&local_778,&local_758,"aggregates = agg;\n");
      Application::offset_abi_cxx11_(&local_1b0,&this->super_Application,3);
      std::operator+(&local_7b8,&local_778,&local_1b0);
      std::operator+(&local_840,&local_7b8,"compAggregates = cagg;\n");
      Application::offset_abi_cxx11_(&local_1d0,&this->super_Application,2);
      std::operator+(&local_818,&local_840,&local_1d0);
      std::operator+(&local_7f8,&local_818,"}\n");
      Application::offset_abi_cxx11_(&local_c0,&this->super_Application,1);
      std::operator+(&local_860,&local_7f8,&local_c0);
      std::operator+(&thresholdStruct,&local_860,"};\n\n");
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_2f0);
      Application::offset_abi_cxx11_(&local_510,&this->super_Application,1);
      std::operator+(&local_3b0,&thresholdStruct,&local_510);
      std::operator+(&local_390,&local_3b0,"size_t numberOfThresholds;\n");
      Application::offset_abi_cxx11_(&local_530,&this->super_Application,1);
      std::operator+(&local_370,&local_390,&local_530);
      std::operator+(&local_4f0,&local_370,"double* variance = nullptr;\n");
      Application::offset_abi_cxx11_(&local_3d0,&this->super_Application,1);
      std::operator+(&local_4d0,&local_4f0,&local_3d0);
      std::operator+(&local_350,&local_4d0,"Threshold* thresholdMap = nullptr;\n\n");
      Application::offset_abi_cxx11_(&local_550,&this->super_Application,1);
      std::operator+(&local_4b0,&local_350,&local_550);
      std::operator+(&local_490,&local_4b0,"void initCostArray()\n");
      Application::offset_abi_cxx11_(&local_570,&this->super_Application,1);
      std::operator+(&local_470,&local_490,&local_570);
      std::operator+(&local_5b0,&local_470,"{\n");
      std::operator+(&local_658,&local_5b0,&initVariance);
      Application::offset_abi_cxx11_(&local_3f0,&this->super_Application,2);
      std::operator+(&local_638,&local_658,&local_3f0);
      std::operator+(&local_6b8,&local_638,"thresholdMap = new Threshold[numberOfThresholds];\n");
      std::operator+(&local_6f8,&local_6b8,&functionIndex);
      Application::offset_abi_cxx11_(&local_410,&this->super_Application,1);
      std::operator+(&local_718,&local_6f8,&local_410);
      std::operator+(&local_758,&local_718,"}\n\n");
      Application::offset_abi_cxx11_(&local_430,&this->super_Application,1);
      std::operator+(&local_778,&local_758,&local_430);
      std::operator+(&local_7b8,&local_778,"void computeCost()\n");
      Application::offset_abi_cxx11_(&local_590,&this->super_Application,1);
      std::operator+(&local_840,&local_7b8,&local_590);
      std::operator+(&local_818,&local_840,"{\n");
      std::operator+(&local_7f8,&local_818,&computeVariance);
      Application::offset_abi_cxx11_(&local_450,&this->super_Application,1);
      std::operator+(&local_860,&local_7f8,&local_450);
      std::operator+(__return_storage_ptr__,&local_860,"}\n");
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&thresholdStruct);
      std::__cxx11::string::~string((string *)&functionIndex);
      std::__cxx11::string::~string((string *)&computeVariance);
      std::__cxx11::string::~string((string *)&categFunctionIndex);
      std::__cxx11::string::~string((string *)&contFunctionIndex);
      std::__cxx11::string::~string((string *)&categVariance);
      std::__cxx11::string::~string((string *)&contVariance);
      std::__cxx11::string::~string((string *)&initVariance);
      std::__cxx11::string::~string((string *)&numOfThresholds);
      std::_Vector_base<Query_*,_std::allocator<Query_*>_>::~_Vector_base
                (&complementQueryPerView.super__Vector_base<Query_*,_std::allocator<Query_*>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&firstThreshold.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&functionPerView);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&variancePerView);
      return __return_storage_ptr__;
    }
    if (variancePerView.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[__val].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        variancePerView.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[__val].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::to_string(&functionIndex,__val);
      std::operator+(&computeVariance,"V",&functionIndex);
      std::__cxx11::string::~string((string *)&functionIndex);
      pVVar13 = QueryCompiler::getView
                          ((this->_compiler).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           __val);
      if ((pVVar13->_fVars).super__Base_bitset<2UL>._M_w[1] == 0 &&
          (pVVar13->_fVars).super__Base_bitset<2UL>._M_w[0] == 0) {
        Application::offset_abi_cxx11_(&local_7b8,&this->super_Application,2);
        std::operator+(&local_840,&local_7b8,&computeVariance);
        std::operator+(&local_818,&local_840,"_tuple& ");
        std::operator+(&local_7f8,&local_818,&computeVariance);
        std::operator+(&local_860,&local_7f8,"tuple = ");
        std::operator+(&thresholdStruct,&local_860,&computeVariance);
        std::operator+(&functionIndex,&thresholdStruct,"[0];\n");
        std::__cxx11::string::append((string *)&contVariance);
        std::__cxx11::string::~string((string *)&functionIndex);
        std::__cxx11::string::~string((string *)&thresholdStruct);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        std::__cxx11::string::~string((string *)&local_840);
        std::__cxx11::string::~string((string *)&local_7b8);
        local_870 = 0;
        for (uVar20 = 0; puVar3 = (unsigned_long *)((long)local_820 + uVar20),
            uVar20 < (ulong)((long)variancePerView.
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[__val].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)variancePerView.
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[__val].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar20 = uVar20 + 1) {
          Application::offset_abi_cxx11_(&local_818,&this->super_Application,2);
          std::operator+(&local_7f8,&local_818,"variance[");
          std::__cxx11::to_string(&local_840,(unsigned_long)puVar3);
          std::operator+(&local_860,&local_7f8,&local_840);
          std::operator+(&thresholdStruct,&local_860,"] = ");
          std::operator+(&functionIndex,&thresholdStruct,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((variancePerView.
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[__val].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         local_870));
          std::__cxx11::string::append((string *)&contVariance);
          std::__cxx11::string::~string((string *)&functionIndex);
          std::__cxx11::string::~string((string *)&thresholdStruct);
          std::__cxx11::string::~string((string *)&local_860);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_7f8);
          std::__cxx11::string::~string((string *)&local_818);
          Application::offset_abi_cxx11_(&local_818,&this->super_Application,2);
          std::operator+(&local_7f8,&local_818,"thresholdMap[");
          std::__cxx11::to_string(&local_840,(unsigned_long)puVar3);
          std::operator+(&local_860,&local_7f8,&local_840);
          std::operator+(&thresholdStruct,&local_860,"]");
          std::operator+(&functionIndex,&thresholdStruct,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((functionPerView.
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[__val].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         local_870));
          std::__cxx11::string::append((string *)&contFunctionIndex);
          std::__cxx11::string::~string((string *)&functionIndex);
          std::__cxx11::string::~string((string *)&thresholdStruct);
          std::__cxx11::string::~string((string *)&local_860);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_7f8);
          std::__cxx11::string::~string((string *)&local_818);
          local_870 = local_870 + 0x20;
        }
      }
      else {
        if (0x20 < (ulong)((long)variancePerView.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[__val].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)variancePerView.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[__val].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::operator<<((ostream *)&std::cerr,"THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
LAB_00166fa5:
          exit(1);
        }
        ppAVar2 = (complementQueryPerView.super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[__val]->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar3 = *(unsigned_long **)
                  &((*ppAVar2)->_incoming).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data;
        lVar21 = *(long *)(*(long *)&(ppAVar2[1]->_incoming).
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data + 8);
        if (((puVar3[1] != lVar21 - 1U) ||
            (lVar7 = *(long *)(*(long *)&(ppAVar2[2]->_incoming).
                                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data + 8),
            puVar3[1] != lVar7 - 2U)) || (lVar21 != lVar7 + -1)) {
          std::operator<<((ostream *)&std::cerr,
                          "We should have expected the aggregates to be contiguous!\n");
          goto LAB_00166fa5;
        }
        Application::offset_abi_cxx11_(&local_270,&this->super_Application,2);
        std::operator+(&local_330,&local_270,"compaggs = &V");
        std::__cxx11::to_string(&local_290,*puVar3);
        std::operator+(&local_250,&local_330,&local_290);
        std::operator+(&local_310,&local_250,"[0].aggregates[");
        std::__cxx11::to_string(&local_2b0,puVar3[1]);
        std::operator+(&local_230,&local_310,&local_2b0);
        std::operator+(&local_2f0,&local_230,"];\n");
        Application::offset_abi_cxx11_(&local_2d0,&this->super_Application,2);
        std::operator+(&local_210,&local_2f0,&local_2d0);
        std::operator+(&local_450,&local_210,"for (");
        std::operator+(&local_590,&local_450,&computeVariance);
        std::operator+(&local_430,&local_590,"_tuple& ");
        std::operator+(&local_410,&local_430,&computeVariance);
        std::operator+(&local_3f0,&local_410,"tuple : ");
        std::operator+(&local_570,&local_3f0,&computeVariance);
        std::operator+(&local_550,&local_570,")\n");
        Application::offset_abi_cxx11_(&local_110,&this->super_Application,2);
        std::operator+(&local_3d0,&local_550,&local_110);
        std::operator+(&local_530,&local_3d0,"{\n");
        Application::offset_abi_cxx11_(&local_130,&this->super_Application,3);
        std::operator+(&local_510,&local_530,&local_130);
        std::operator+(&local_3b0,&local_510,"if(");
        std::operator+(&local_390,&local_3b0,&computeVariance);
        std::operator+(&local_370,&local_390,"tuple.aggregates[0] == 0 || ");
        std::operator+(&local_4f0,&local_370,&computeVariance);
        std::operator+(&local_4d0,&local_4f0,"tuple.aggregates[0] == compaggs[0])\n");
        Application::offset_abi_cxx11_(&local_150,&this->super_Application,3);
        std::operator+(&local_350,&local_4d0,&local_150);
        std::operator+(&local_4b0,&local_350,"{\n");
        Application::offset_abi_cxx11_(&local_170,&this->super_Application,4);
        std::operator+(&local_490,&local_4b0,&local_170);
        std::operator+(&local_470,&local_490,"variance[categIdx++] = 1.79769e+308;\n");
        Application::offset_abi_cxx11_(&local_190,&this->super_Application,4);
        std::operator+(&local_5b0,&local_470,&local_190);
        std::operator+(&local_658,&local_5b0,"continue;\n");
        Application::offset_abi_cxx11_(&local_1b0,&this->super_Application,3);
        std::operator+(&local_638,&local_658,&local_1b0);
        std::operator+(&local_6b8,&local_638,"}\n");
        Application::offset_abi_cxx11_(&local_1d0,&this->super_Application,3);
        std::operator+(&local_6f8,&local_6b8,&local_1d0);
        std::operator+(&local_718,&local_6f8,"for (size_t i=0; i < 3; ++i)\n");
        Application::offset_abi_cxx11_(&local_c0,&this->super_Application,4);
        std::operator+(&local_758,&local_718,&local_c0);
        std::operator+(&local_778,&local_758,"difference[i] = compaggs[i] - ");
        std::operator+(&local_7b8,&local_778,&computeVariance);
        std::operator+(&local_840,&local_7b8,"tuple.aggregates[i];\n");
        Application::offset_abi_cxx11_(&local_50,&this->super_Application,3);
        std::operator+(&local_818,&local_840,&local_50);
        std::operator+(&local_7f8,&local_818,"variance[categIdx++] = ");
        std::operator+(&local_860,&local_7f8,
                       variancePerView.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[__val].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        Application::offset_abi_cxx11_(&local_70,&this->super_Application,2);
        std::operator+(&thresholdStruct,&local_860,&local_70);
        std::operator+(&functionIndex,&thresholdStruct,"}\n");
        std::__cxx11::string::append((string *)&categVariance);
        std::__cxx11::string::~string((string *)&functionIndex);
        std::__cxx11::string::~string((string *)&thresholdStruct);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_840);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_778);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_270);
        Application::offset_abi_cxx11_(&local_758,&this->super_Application,2);
        std::operator+(&local_778,&local_758,"for (V");
        std::__cxx11::to_string(&local_718,__val);
        std::operator+(&local_7b8,&local_778,&local_718);
        std::operator+(&local_840,&local_7b8,"_tuple& tuple : V");
        std::__cxx11::to_string(&local_6f8,__val);
        std::operator+(&local_818,&local_840,&local_6f8);
        std::operator+(&local_7f8,&local_818,")\n");
        Application::offset_abi_cxx11_(&local_6b8,&this->super_Application,3);
        std::operator+(&local_860,&local_7f8,&local_6b8);
        std::operator+(&thresholdStruct,&local_860,"thresholdMap[categIdx++]");
        std::operator+(&functionIndex,&thresholdStruct,
                       functionPerView.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[__val].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::append((string *)&categFunctionIndex);
        std::__cxx11::string::~string((string *)&functionIndex);
        std::__cxx11::string::~string((string *)&thresholdStruct);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_840);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_778);
        std::__cxx11::string::~string((string *)&local_758);
        puVar3 = local_820;
      }
      local_820 = puVar3;
      std::__cxx11::string::~string((string *)&computeVariance);
    }
    __val = __val + 1;
  } while( true );
}

Assistant:

std::string RegressionTree::genVarianceComputation()
{
    std::vector<std::vector<std::string>> variancePerView(_compiler->numberOfViews());
    //TODO: rename this to thresholdPerView
    std::vector<std::vector<std::string>> functionPerView(_compiler->numberOfViews());
    std::vector<size_t> firstThreshold(NUM_OF_VARIABLES);
    std::vector<Query*> complementQueryPerView(_compiler->numberOfViews());
    
    for (QueryThresholdPair& qtPair : queryToThreshold)
    {
        if (_categoricalFeatures[qtPair.varID])
        {
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            Query* complement = qtPair.complementQuery;
            const size_t& comp_viewID = complement->_aggregates[0]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3)
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& comp_count = complement->_aggregates[0]->_incoming[0].second;
            // const size_t& comp_linear=complement->_aggregates[1]->_incoming[0].second;
            // const size_t& comp_quad = complement->_aggregates[2]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
        
            // variancePerView[viewID].push_back(
            //     "("+viewTup+".aggregates["+std::to_string(count)+"] > 0 ? "+
            //     viewTup+".aggregates["+std::to_string(quad)+"] - ("+
            //     viewTup+".aggregates["+std::to_string(linear)+"] * "+
            //     viewTup+".aggregates["+std::to_string(linear)+"]) / "+
            //     viewTup+".aggregates["+std::to_string(count)+"] : 999);\n"
            //     );
            
            variancePerView[viewID].push_back(
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                "difference[2] - (difference[1] * difference[1]) / difference[0];\n"
                );

            complementQueryPerView[viewID] = complement;
            
            Attribute* att = _td->getAttribute(qtPair.varID);

            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: \"+std::to_string(tuple."+att->_name+")+\" "+
            //     "Operator: = \";\n");

            // TODO:TODO:TODO:TODO:TODO:TODO: WHY DOES THIS SAY AGGREGATES[QUAD] !?!?!
            functionPerView[viewID].push_back(
                ".set("+std::to_string(qtPair.varID)+",tuple."+att->_name+",1,"+
                "&tuple.aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(comp_viewID)+"[0].aggregates["+
                std::to_string(comp_count)+"]"+");\n");
        }
        else
        {   // Continuous variable
            
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            size_t& cviewID = query->_aggregates[3]->_incoming[0].first;
            size_t& cviewID2 = query->_aggregates[4]->_incoming[0].first;
            size_t& cviewID3 = query->_aggregates[5]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3 ||
                cviewID != viewID || cviewID2 != viewID || cviewID3 != viewID  )
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& compcount = query->_aggregates[3]->_incoming[0].second;
            const size_t& complinear = query->_aggregates[4]->_incoming[0].second;
            const size_t& compquad = query->_aggregates[5]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
            
            variancePerView[viewID].push_back(
                "(("+viewTup+".aggregates["+std::to_string(count)+"] > 0  && "+
                viewTup+".aggregates["+std::to_string(compcount)+"] > 0) ? "+
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                viewTup+".aggregates["+std::to_string(compquad)+"] - ("+
                viewTup+".aggregates["+std::to_string(complinear)+"] * "+
                viewTup+".aggregates["+std::to_string(complinear)+"]) / "+
                viewTup+".aggregates["+std::to_string(compcount)+"] : 1.79769e+308);\n"
                );
           
            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: "+std::to_string(qtPair.function->_parameter[0])+" "+
            //     "Operator: < \";\n");
            functionPerView[viewID].push_back(".set("+std::to_string(qtPair.varID)+","+
                std::to_string(qtPair.function->_parameter[0])+",0,"+
                "&V"+std::to_string(viewID)+"[0].aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(cviewID)+"[0].aggregates["+
                std::to_string(compcount)+"]"+");\n");
        }
        
    }

    std::string numOfThresholds = "numberOfThresholds = ";
    size_t numOfContThresholds = 0;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        
        if (!_categoricalFeatures.test(var))
        {
            firstThreshold[var] = numOfContThresholds;
            numOfContThresholds += _thresholds[var].size();
        }
        else
        {
            size_t& viewID = _varToQueryMap[var]->_aggregates[0]->_incoming[0].first;   
            numOfThresholds += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    numOfThresholds += std::to_string(numOfContThresholds)+";\n";

    std::string initVariance = offset(2)+numOfThresholds +
        offset(2)+"variance = new double[numberOfThresholds];\n";
    
    std::string contVariance = "", categVariance = "";
    std::string contFunctionIndex = "", categFunctionIndex = "";
    
    size_t varianceCount = 0;
    for (size_t viewID = 0; viewID < _compiler->numberOfViews(); ++viewID)
    {
        if (!variancePerView[viewID].empty())
        {
            std::string viewString = "V"+std::to_string(viewID);
            
            if (_compiler->getView(viewID)->_fVars.any())
            {
                // categVariance += offset(2)+"for ("+viewString+"_tuple& "+
                //     viewString+"tuple : "+viewString+")\n";
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += offset(3)+
                //         "variance[categIdx++] = "+variancePerView[viewID][j];
                    
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
                
                if (variancePerView[viewID].size() > 1)
                {
                    ERROR("THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
                    exit(1);
                }

                Query* complement = complementQueryPerView[viewID];
                const size_t& comp_viewID =
                    complement->_aggregates[0]->_incoming[0].first;
                const size_t& comp_count =
                    complement->_aggregates[0]->_incoming[0].second;
                const size_t& comp_linear =
                    complement->_aggregates[1]->_incoming[0].second;
                const size_t& comp_quad =
                    complement->_aggregates[2]->_incoming[0].second;

                if (comp_count != comp_linear-1 || comp_count != comp_quad-2 ||
                    comp_linear != comp_quad-1)
                {    
                    ERROR("We should have expected the aggregates to be contiguous!\n");
                    exit(1);
                }

                // std::cout << "complement: " << comp_viewID << "  " << viewID << "\n";
                // std::cout << complement->_fVars << std::endl;
                // std::cout << _compiler->getView(viewID)->_fVars << std::endl;
                
                categVariance += offset(2)+"compaggs = &V"+std::to_string(comp_viewID)+
                    "[0].aggregates["+std::to_string(comp_count)+"];\n"+
                    offset(2)+"for ("+viewString+"_tuple& "+viewString+"tuple : "+
                    viewString+")\n"+offset(2)+"{\n"+
                    offset(3)+"if("+viewString+"tuple.aggregates[0] == 0 || "+
                    viewString+"tuple.aggregates[0] == compaggs[0])\n"+
                    offset(3)+"{\n"+
                    offset(4)+"variance[categIdx++] = 1.79769e+308;\n"+
                    offset(4)+"continue;\n"+
                    offset(3)+"}\n"+
                    offset(3)+"for (size_t i=0; i < 3; ++i)\n"+
                    offset(4)+"difference[i] = compaggs[i] - "+
                    viewString+"tuple.aggregates[i];\n"+
                    offset(3)+"variance[categIdx++] = "+variancePerView[viewID][0]+
                    offset(2)+"}\n";
                
                // categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                //     "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                //     "thresholdMap[categIdx++] = "+functionPerView[viewID][0];
                categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                    "thresholdMap[categIdx++]"+functionPerView[viewID][0];
                
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += "variance[categIdx++] = "+
                //         variancePerView[viewID][0];
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
            }
            else
            {
                contVariance += offset(2)+viewString+"_tuple& "+
                    viewString+"tuple = "+viewString+"[0];\n";
                                
                for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                {
                    contVariance += offset(2)+
                        "variance["+std::to_string(varianceCount)+"] = "+
                        variancePerView[viewID][j];

                    // contFunctionIndex += offset(2)+
                    //     "thresholdMap["+std::to_string(varianceCount)+"] = "+
                    //     functionPerView[viewID][j];
                    contFunctionIndex += offset(2)+
                        "thresholdMap["+std::to_string(varianceCount)+"]"+
                        functionPerView[viewID][j];
                    
                    ++varianceCount;
                }
            }
        }
    }

    std::string computeVariance = contVariance;
    
    if (!categVariance.empty())
    {    
        computeVariance += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+
            offset(2)+"double difference[3], *compaggs;\n"+
            categVariance;
    }
    
    computeVariance += "\n"+offset(2)+"double min_variance = variance[0];\n"+
        offset(2)+"size_t threshold = 0;\n\n"+
        offset(2)+"for (size_t t=1; t < numberOfThresholds; ++t)\n"+offset(2)+"{\n"+
        offset(3)+"if (variance[t] < min_variance)\n"+offset(3)+"{\n"+
        offset(4)+"min_variance = variance[t];\n"+offset(4)+"threshold = t;\n"+
        offset(3)+"}\n"+offset(2)+"}\n"+
        offset(2)+"std::cout << \"The minimum variance is: \" << min_variance <<"+
        "\" for variable \" << thresholdMap[threshold].varID << \" and threshold:"+
        " \" << thresholdMap[threshold].threshold << std::endl;\n"+
        offset(2)+"std::ofstream ofs(\"bestsplit.out\",std::ofstream::out);\n"+
        offset(2)+"ofs << std::fixed << min_variance << \"\\t\" << "+
        "thresholdMap[threshold].varID << \"\\t\" << "+
        "thresholdMap[threshold].threshold  << \"\\t\" << "+
        "thresholdMap[threshold].categorical  << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[0]  << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[1]/thresholdMap[threshold].aggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[1]/thresholdMap[threshold].compAggregates[0] << std::endl;\n"+
        offset(2)+"ofs.close();\n";

    std::string functionIndex = contFunctionIndex;

    if (!categFunctionIndex.empty())
    {
        functionIndex += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+categFunctionIndex;
    }

    std::string thresholdStruct = offset(1)+"struct Threshold\n"+offset(1)+"{\n"+
        offset(2)+"size_t varID;\n"+offset(2)+"double threshold;\n"+
        offset(2)+"bool categorical;\n"+offset(2)+"double* aggregates;\n"+
        offset(2)+"double* compAggregates;\n"+offset(2)+
        "Threshold() : varID(0), threshold(0), categorical(false), "+
        "aggregates(nullptr), compAggregates(nullptr) {}\n"+
        offset(2)+"void set(size_t var, double t, bool c, double* agg, double *cagg)\n"+
        offset(2)+"{\n"+offset(3)+"varID = var;\n"+offset(3)+"threshold = t;\n"+
        offset(3)+"categorical = c;\n"+offset(3)+"aggregates = agg;\n"+
        offset(3)+"compAggregates = cagg;\n"+
        offset(2)+"}\n"+offset(1)+"};\n\n";
    
    return thresholdStruct+
        offset(1)+"size_t numberOfThresholds;\n"+
        offset(1)+"double* variance = nullptr;\n"+
        offset(1)+"Threshold* thresholdMap = nullptr;\n\n"+
        offset(1)+"void initCostArray()\n"+
        offset(1)+"{\n"+initVariance+
        // offset(2)+"thresholdMap = new std::string[numberOfThresholds];\n"+
        offset(2)+"thresholdMap = new Threshold[numberOfThresholds];\n"+
        functionIndex+offset(1)+"}\n\n"+
        offset(1)+"void computeCost()\n"+
        offset(1)+"{\n"+computeVariance+offset(1)+"}\n";    
}